

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

void __thiscall CProficiencies::ListKnownProficiencies(CProficiencies *this,char_data *player)

{
  string_view fmt;
  bool bVar1;
  size_t sVar2;
  reference pbVar3;
  long in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> response;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string_view in_stack_00000070;
  string profStr;
  char *profName;
  int i;
  size_t limit;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  responseList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdf8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe00;
  CHAR_DATA *in_stack_fffffffffffffe08;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe10;
  CLogger *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  CProficiencies *in_stack_fffffffffffffe40;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  undefined1 *local_1a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_198;
  char **local_190;
  undefined1 local_188 [64];
  char *local_148;
  char *local_128;
  int local_11c;
  ulong local_118;
  undefined1 local_110 [56];
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_const_char_*,_char_*>
  local_d8;
  undefined8 local_b8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_const_char_*,_char_*>
  *local_b0;
  char **local_a8;
  char **local_98;
  v9 *local_90;
  char **local_88;
  size_t sStack_80;
  undefined1 *local_78;
  char *local_70;
  char ***local_68;
  char *local_60;
  char ***local_58;
  char ***local_50;
  char **local_48;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_const_char_*,_char_*>
  *local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_const_char_*,_char_*>
  *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_const_char_*,_char_*>
  *local_10;
  char *local_8;
  
  if (in_RSI == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
    fmt._M_str._0_4_ = in_stack_fffffffffffffe30;
    fmt._M_len = in_RDI;
    fmt._M_str._4_4_ = in_stack_fffffffffffffe34;
    CLogger::Debug<>(in_stack_fffffffffffffe20,fmt);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x7ab3f8);
    local_118 = std::size<int,25ul>((int (*) [25])(in_RDI + 0x14));
    for (local_11c = 0; (ulong)(long)local_11c < local_118; local_11c = local_11c + 1) {
      if (-1 < *(int *)(in_RDI + 0x14 + (long)local_11c * 4)) {
        char_data::Profs(*(char_data **)(in_RDI + 8));
        GetProficiency(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
        local_128 = local_148;
        local_68 = &local_190;
        local_70 = "You are {} at {}.\n\r";
        local_60 = "You are {} at {}.\n\r";
        local_190 = (char **)0x835080;
        in_stack_fffffffffffffe10 = (basic_string_view<char,_std::char_traits<char>_> *)local_188;
        local_58 = local_68;
        sVar2 = std::char_traits<char>::length((char_type *)0x7ab4eb);
        in_stack_fffffffffffffe10->_M_len = sVar2;
        local_8 = local_70;
        in_stack_fffffffffffffe08 = (CHAR_DATA *)char_data::Profs(*(char_data **)(in_RDI + 8));
        in_stack_fffffffffffffe00 =
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)GetSkillLevelName((CProficiencies *)
                                  CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                  in_stack_fffffffffffffe34);
        local_78 = local_188 + 8;
        local_88 = local_190;
        sStack_80 = local_188._0_8_;
        local_90 = (v9 *)&local_198;
        local_98 = &local_128;
        local_50 = &local_88;
        local_a8 = local_190;
        local_198 = in_stack_fffffffffffffe00;
        local_48 = local_a8;
        ::fmt::v9::
        make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char_const*&,char*&>
                  (&local_d8,local_90,local_98,local_190);
        local_30 = &local_b8;
        local_38 = &local_d8;
        local_20 = 0xcc;
        local_b8 = 0xcc;
        local_28 = local_38;
        local_18 = local_30;
        local_10 = local_38;
        local_b0 = local_38;
        ::fmt::v9::vformat_abi_cxx11_(in_stack_00000070,(format_args)___begin2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffe10,(value_type *)in_stack_fffffffffffffe08);
        std::__cxx11::string::~string((string *)(local_188 + 8));
      }
    }
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffe10);
    if (bVar1) {
      send_to_char((char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    }
    else {
      send_to_char((char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      local_1a0 = local_110;
      local_1a8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(in_stack_fffffffffffffdf8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(in_stack_fffffffffffffdf8);
      while (bVar1 = __gnu_cxx::operator!=
                               (in_stack_fffffffffffffe00,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffdf8), bVar1) {
        pbVar3 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_1a8);
        std::__cxx11::string::string((string *)&stack0xfffffffffffffe30,(string *)pbVar3);
        std::__cxx11::string::c_str();
        send_to_char((char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_1a8);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffe10);
  }
  return;
}

Assistant:

void CProficiencies::ListKnownProficiencies(char_data* player)
{
	if (player == nullptr)
	{
		RS.Logger.Debug("CProficiencies::ListKnownProficiencies: Player is null.");
		return;
	}

	std::vector<std::string> responseList;

	auto limit = std::size(profs);
	for (int i = 0; i < limit ; i++)
	{
		if(profs[i] < 0)
			continue;
		
		char* profName = ch->Profs()->GetProficiency(i).name;
		auto profStr = fmt::format("You are {} at {}.\n\r", ch->Profs()->GetSkillLevelName(i), profName);
		responseList.push_back(profStr);
	}

	if (responseList.empty())
	{
		send_to_char("You currently have no proficiencies.\n\r", player);
	}
	else
	{
		send_to_char("Your proficiencies are:\n\r", player);
		for (auto response : responseList)
		{
			send_to_char(response.c_str(), player);
		}
	}	
}